

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<8,_2,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  long lVar3;
  int row;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  Vector<float,_3> res_2;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Vector<float,_3> res_4;
  Vector<float,_3> res;
  Mat3 m_1;
  Mat3 m;
  Vec4 *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  float local_e0 [4];
  float local_d0 [4];
  float local_c0 [4];
  Matrix<float,_3,_3> local_b0;
  Matrix<float,_3,_3> local_8c;
  undefined8 local_68;
  float fStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  float fStack_54;
  undefined8 uStack_50;
  float local_48;
  undefined8 local_38;
  float fStack_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  float fStack_24;
  undefined8 uStack_20;
  float local_18;
  
  puVar2 = &local_38;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar6 = 0x3f800000;
      if (lVar3 != lVar5) {
        uVar6 = 0;
      }
      *(undefined4 *)((long)puVar2 + lVar5) = uVar6;
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar4 = lVar4 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    lVar3 = lVar3 + 0xc;
  } while (lVar4 != 3);
  local_38 = *(undefined8 *)evalCtx->in[0].m_data;
  fStack_30 = evalCtx->in[0].m_data[2];
  uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
  fStack_24 = evalCtx->in[1].m_data[2];
  uStack_2c = (undefined4)uVar1;
  uStack_28 = (undefined4)((ulong)uVar1 >> 0x20);
  uStack_20 = *(undefined8 *)evalCtx->in[2].m_data;
  local_18 = evalCtx->in[2].m_data[2];
  decrement<float,3,3>(&local_8c,(MatrixCaseUtils *)&local_38,(Matrix<float,_3,_3> *)0x3);
  local_b0.m_data.m_data[0].m_data[2] = 0.0;
  local_b0.m_data.m_data[0].m_data[0] = 0.0;
  local_b0.m_data.m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    local_b0.m_data.m_data[0].m_data[lVar3] =
         local_8c.m_data.m_data[0].m_data[lVar3] + local_8c.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_d0[2] = 0.0;
  local_d0[0] = 0.0;
  local_d0[1] = 0.0;
  lVar3 = 0;
  do {
    local_d0[lVar3] =
         local_b0.m_data.m_data[0].m_data[lVar3] + local_8c.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  puVar2 = &local_68;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar6 = 0x3f800000;
      if (lVar3 != lVar5) {
        uVar6 = 0;
      }
      *(undefined4 *)((long)puVar2 + lVar5) = uVar6;
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar4 = lVar4 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    lVar3 = lVar3 + 0xc;
  } while (lVar4 != 3);
  local_68 = *(undefined8 *)evalCtx->in[0].m_data;
  fStack_60 = evalCtx->in[0].m_data[2];
  uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
  fStack_54 = evalCtx->in[1].m_data[2];
  uStack_5c = (undefined4)uVar1;
  uStack_58 = (undefined4)((ulong)uVar1 >> 0x20);
  uStack_50 = *(undefined8 *)evalCtx->in[2].m_data;
  local_48 = evalCtx->in[2].m_data[2];
  decrement<float,3,3>(&local_b0,(MatrixCaseUtils *)&local_68,(Matrix<float,_3,_3> *)0x3);
  local_f0 = (ulong)local_f0._4_4_ << 0x20;
  local_f8 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_f8 + lVar3 * 4) =
         local_b0.m_data.m_data[0].m_data[lVar3] + local_b0.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_e0[2] = 0.0;
  local_e0[0] = 0.0;
  local_e0[1] = 0.0;
  lVar3 = 0;
  do {
    local_e0[lVar3] =
         *(float *)((long)&local_f8 + lVar3 * 4) +
         *(float *)((long)(local_8c.m_data.m_data + -1) + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  local_c0[2] = 0.0;
  lVar3 = 0;
  do {
    local_d0[lVar3 + 4] = local_d0[lVar3] + local_e0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_f8 = &evalCtx->color;
  local_f0 = 0x100000000;
  local_e8 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_f8 + lVar3 * 4)] = local_d0[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}